

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void check_joyp_intr(Emulator *e)

{
  byte bVar1;
  u8 p10_p13;
  Emulator *e_local;
  
  call_joyp_callback(e,TRUE);
  bVar1 = read_joyp_p10_p13(e);
  if ((byte)((bVar1 ^ (e->state).joyp.last_p10_p13) & (bVar1 ^ 0xff)) != 0) {
    (e->state).interrupt.new_if = (e->state).interrupt.new_if | 0x10;
  }
  (e->state).joyp.last_p10_p13 = bVar1;
  return;
}

Assistant:

static void check_joyp_intr(Emulator* e) {
  call_joyp_callback(e, TRUE);
  u8 p10_p13 = read_joyp_p10_p13(e);
  /* joyp interrupt only triggers on p10-p13 going from high to low (i.e. not
   * pressed to pressed). */
  if ((p10_p13 ^ JOYP.last_p10_p13) & ~p10_p13) {
    INTR.new_if |= IF_JOYPAD;
  }
  JOYP.last_p10_p13 = p10_p13;
}